

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum256.c
# Opt level: O2

uint64_t * Hacl_Bignum256_new_bn_from_bytes_le(uint32_t len,uint8_t *b)

{
  long lVar1;
  uint8_t *__src;
  uint64_t *puVar2;
  ulong __n;
  size_t __n_00;
  uint64_t *os;
  uint32_t i;
  size_t sVar3;
  void *__dest;
  uint uVar4;
  uint uVar5;
  undefined8 uStack_50;
  uint64_t uStack_48;
  undefined1 *local_40;
  uint8_t *local_38;
  
  if ((len != 0) && (uVar4 = len - 1 >> 3, uVar4 != 0x1fffffff)) {
    uVar4 = uVar4 + 1;
    uStack_50 = 0x134ca2;
    puVar2 = (uint64_t *)calloc((ulong)uVar4,8);
    if (puVar2 != (uint64_t *)0x0) {
      uVar5 = uVar4 * 8;
      lVar1 = -((ulong)uVar5 + 0xf & 0xfffffffffffffff0);
      __dest = (void *)((long)&uStack_48 + lVar1);
      __n = (ulong)len;
      sVar3 = 0;
      __n_00 = uVar5 - __n;
      if (uVar5 <= len) {
        __n_00 = sVar3;
      }
      local_40 = (undefined1 *)&uStack_48;
      local_38 = b;
      *(undefined8 *)((long)&uStack_50 + lVar1) = 0x134cea;
      memset((void *)(__n + (long)__dest),0,__n_00);
      __src = local_38;
      *(undefined8 *)((long)&uStack_50 + lVar1) = 0x134cf9;
      memcpy(__dest,__src,__n);
      for (; uVar4 != sVar3; sVar3 = sVar3 + 1) {
        puVar2[sVar3] = *(uint64_t *)((long)__dest + sVar3 * 8);
      }
      return puVar2;
    }
  }
  return (uint64_t *)0x0;
}

Assistant:

uint64_t *Hacl_Bignum256_new_bn_from_bytes_le(uint32_t len, uint8_t *b)
{
  if (len == 0U || !((len - 1U) / 8U + 1U <= 536870911U))
  {
    return NULL;
  }
  KRML_CHECK_SIZE(sizeof (uint64_t), (len - 1U) / 8U + 1U);
  uint64_t *res = (uint64_t *)KRML_HOST_CALLOC((len - 1U) / 8U + 1U, sizeof (uint64_t));
  if (res == NULL)
  {
    return res;
  }
  uint64_t *res1 = res;
  uint64_t *res2 = res1;
  uint32_t bnLen = (len - 1U) / 8U + 1U;
  uint32_t tmpLen = 8U * bnLen;
  KRML_CHECK_SIZE(sizeof (uint8_t), tmpLen);
  uint8_t tmp[tmpLen];
  memset(tmp, 0U, tmpLen * sizeof (uint8_t));
  memcpy(tmp, b, len * sizeof (uint8_t));
  for (uint32_t i = 0U; i < (len - 1U) / 8U + 1U; i++)
  {
    uint64_t *os = res2;
    uint8_t *bj = tmp + i * 8U;
    uint64_t u = load64_le(bj);
    uint64_t r1 = u;
    uint64_t x = r1;
    os[i] = x;
  }
  return res2;
}